

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_absolute_x_instructions.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::NopAbsoluteXFixture_nop_absx_Test::~NopAbsoluteXFixture_nop_absx_Test
          (NopAbsoluteXFixture_nop_absx_Test *this)

{
  anon_unknown.dwarf_1cf683::NopAbsoluteXFixture_nop_absx_Test::~NopAbsoluteXFixture_nop_absx_Test
            ((NopAbsoluteXFixture_nop_absx_Test *)(this + -0x118));
  return;
}

Assistant:

TEST_P(NopAbsoluteXFixture, nop_absx) {
    stage_instruction(GetParam());
    expected.pc += 2;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0x12));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}